

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  upb_MiniTableField *puVar5;
  upb_Map *map;
  upb_Message *msg_00;
  upb_Array *puVar6;
  long *plVar7;
  uint uVar8;
  upb_MiniTable *puVar9;
  uintptr_t uVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  
  if (((msg->field_0).internal_opaque & 1) == 0) {
    uVar10 = (msg->field_0).internal_opaque | 1;
    (msg->field_0).internal_opaque = uVar10;
    uVar3 = m->field_count_dont_copy_me__upb_internal_use_only;
    if (uVar3 != 0) {
      lVar12 = 0;
      do {
        puVar5 = m->fields_dont_copy_me__upb_internal_use_only;
        bVar1 = (&puVar5->descriptortype_dont_copy_me__upb_internal_use_only)[lVar12];
        bVar2 = (&puVar5->mode_dont_copy_me__upb_internal_use_only)[lVar12];
        uVar8 = (uint)bVar1;
        if ((bVar2 & 0x10) == 0) {
          if ((ulong)(bVar1 - 1) - 9 < 2) {
            puVar9 = *m->subs_dont_copy_me__upb_internal_use_only
                      [*(ushort *)
                        ((long)&puVar5->submsg_index_dont_copy_me__upb_internal_use_only + lVar12)].
                      submsg_dont_copy_me__upb_internal_use_only;
          }
          else {
LAB_004eaf28:
            puVar9 = (upb_MiniTable *)0x0;
          }
        }
        else {
          if (bVar1 == 5) goto LAB_004eaf28;
          puVar9 = (upb_MiniTable *)0x0;
          if (uVar8 != 0xc) goto LAB_004eb266;
        }
        switch(bVar2 & 3) {
        case 0:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xcc,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar12) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xce,
                          "void _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) {
LAB_004eb144:
            __assert_fail("!upb_MiniTableField_IsExtension(field)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x10d,
                          "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                         );
          }
          map = *(upb_Map **)
                 ((long)&msg->field_0 +
                 (ulong)*(ushort *)
                         ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar12));
          if (((ulong)map & 1) != 0) {
            __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                          ,0x1ac,
                          "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
                         );
          }
          if (map != (upb_Map *)0x0) {
            if (puVar9->field_count_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa5,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            puVar5 = puVar9->fields_dont_copy_me__upb_internal_use_only;
            if (puVar5[1].number_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTableField_Number(f) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa7,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            bVar1 = puVar5[1].descriptortype_dont_copy_me__upb_internal_use_only;
            if ((puVar5[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
              if ((ulong)(bVar1 - 1) - 9 < 2) {
                puVar9 = *puVar9->subs_dont_copy_me__upb_internal_use_only
                          [puVar5[1].submsg_index_dont_copy_me__upb_internal_use_only].
                          submsg_dont_copy_me__upb_internal_use_only;
              }
              else {
LAB_004eb07f:
                puVar9 = (upb_MiniTable *)0x0;
              }
            }
            else {
              if (bVar1 == 5) goto LAB_004eb07f;
              puVar9 = (upb_MiniTable *)0x0;
              if (bVar1 != 0xc) goto LAB_004eb266;
            }
            upb_Map_Freeze(map,puVar9);
          }
          break;
        case 1:
          if (bVar2 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xc4,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if (*(short *)((long)&puVar5->presence + lVar12) != 0) {
            __assert_fail("f->presence == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                          ,0xc6,
                          "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                         );
          }
          if ((bVar2 & 8) != 0) goto LAB_004eb144;
          puVar6 = *(upb_Array **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar12));
          if (puVar6 != (upb_Array *)0x0) {
            upb_Array_Freeze(puVar6,puVar9);
          }
          break;
        case 2:
          if (puVar9 != (upb_MiniTable *)0x0) {
            if ((bVar2 & 0x10) != 0) {
              if ((bVar1 == 5) || (uVar8 == 0xc)) {
LAB_004eb247:
                __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                              ,0x1bd,
                              "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                             );
              }
              goto LAB_004eb266;
            }
            if (1 < (ulong)(uVar8 - 1) - 9) goto LAB_004eb247;
            if (bVar2 < 0xc0) {
              __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                            ,0x1bf,
                            "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                           );
            }
            if ((bVar2 & 8) != 0) goto LAB_004eb144;
            uVar4 = *(ushort *)((long)&puVar5->presence + lVar12);
            if ((-1 < (short)uVar4) ||
               (*(int *)((long)&msg->field_0 + (ulong)(ushort)~uVar4) ==
                *(int *)((long)&puVar5->number_dont_copy_me__upb_internal_use_only + lVar12))) {
              msg_00 = *(upb_Message **)
                        ((long)&msg->field_0 +
                        (ulong)*(ushort *)
                                ((long)&puVar5->offset_dont_copy_me__upb_internal_use_only + lVar12)
                        );
              if (((ulong)msg_00 & 1) != 0) {
                __assert_fail("!upb_TaggedMessagePtr_IsEmpty(ptr)",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/tagged_ptr.h"
                              ,0x28,
                              "struct upb_Message *upb_TaggedMessagePtr_GetNonEmptyMessage(uintptr_t)"
                             );
              }
              if (msg_00 != (upb_Message *)0x0) {
                upb_Message_Freeze(msg_00,puVar9);
              }
            }
          }
        }
        lVar12 = lVar12 + 0xc;
      } while ((ulong)uVar3 * 0xc != lVar12);
      uVar10 = (msg->field_0).internal_opaque;
    }
    puVar11 = (uint *)(uVar10 & 0xfffffffffffffffe);
    if ((puVar11 != (uint *)0x0) && (uVar8 = *puVar11, (ulong)uVar8 != 0)) {
      uVar13 = 0;
      do {
        if ((*(ulong *)(puVar11 + uVar13 * 2 + 2) & 1) != 0) {
          plVar7 = (long *)(*(ulong *)(puVar11 + uVar13 * 2 + 2) & 0xfffffffffffffffc);
          lVar12 = *plVar7;
          bVar1 = *(byte *)(lVar12 + 10);
          if ((*(byte *)(lVar12 + 0xb) & 0x10) == 0) {
            if ((ulong)(bVar1 - 1) - 9 < 2) {
              puVar9 = *(upb_MiniTable **)(lVar12 + 0x18);
            }
            else {
LAB_004eb0fe:
              puVar9 = (upb_MiniTable *)0x0;
            }
          }
          else {
            if (bVar1 == 5) goto LAB_004eb0fe;
            puVar9 = (upb_MiniTable *)0x0;
            if (bVar1 != 0xc) {
LAB_004eb266:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                            ,0x7b,
                            "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                           );
            }
          }
          puVar6 = (upb_Array *)plVar7[1];
          switch(*(byte *)(lVar12 + 0xb) & 3) {
          case 0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                          ,0x131,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
          case 1:
            if (puVar6 != (upb_Array *)0x0) {
              upb_Array_Freeze(puVar6,puVar9);
            }
            break;
          case 2:
            if (((bVar1 & 0xfe) == 10) && (puVar6 != (upb_Array *)0x0)) {
              upb_Message_Freeze((upb_Message *)puVar6,puVar9);
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar8 != uVar13);
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  // TODO: b/376969853 - use iterator API
  uint32_t size = in ? in->size : 0;
  for (size_t i = 0; i < size; i++) {
    upb_TaggedAuxPtr tagged_ptr = in->aux_data[i];
    if (!upb_TaggedAuxPtr_IsExtension(tagged_ptr)) {
      continue;
    }
    const upb_Extension* ext = upb_TaggedAuxPtr_Extension(tagged_ptr);
    const upb_MiniTableExtension* e = ext->ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &(ext->data), sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}